

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O3

void __thiscall leveldb::anon_unknown_3::DBIter::~DBIter(DBIter *this)

{
  pointer pcVar1;
  char *pcVar2;
  
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__DBIter_00132110;
  if (this->iter_ != (Iterator *)0x0) {
    (*this->iter_->_vptr_Iterator[1])();
  }
  pcVar1 = (this->saved_value_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->saved_value_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->saved_key_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->saved_key_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar2 = (this->status_).state_;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  Iterator::~Iterator(&this->super_Iterator);
  return;
}

Assistant:

virtual ~DBIter() {
                delete iter_;
            }